

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isUnpackedArray(Type *this)

{
  if (this->canonical == (Type *)0x0) {
    resolveCanonical(this);
  }
  return ((this->canonical->super_Symbol).kind & ~DeferredMember) == FixedSizeUnpackedArrayType;
}

Assistant:

bool Type::isUnpackedArray() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
            return true;
        default:
            return false;
    }
}